

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_mp3_bind_seek_table
                    (ma_dr_mp3 *pMP3,ma_uint32 seekPointCount,ma_dr_mp3_seek_point *pSeekPoints)

{
  ma_dr_mp3_seek_point *pSeekPoints_local;
  ma_uint32 seekPointCount_local;
  ma_dr_mp3 *pMP3_local;
  ma_bool32 local_4;
  
  if (pMP3 == (ma_dr_mp3 *)0x0) {
    local_4 = 0;
  }
  else {
    if ((seekPointCount == 0) || (pSeekPoints == (ma_dr_mp3_seek_point *)0x0)) {
      pMP3->seekPointCount = 0;
      pMP3->pSeekPoints = (ma_dr_mp3_seek_point *)0x0;
    }
    else {
      pMP3->seekPointCount = seekPointCount;
      pMP3->pSeekPoints = pSeekPoints;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

MA_API ma_bool32 ma_dr_mp3_bind_seek_table(ma_dr_mp3* pMP3, ma_uint32 seekPointCount, ma_dr_mp3_seek_point* pSeekPoints)
{
    if (pMP3 == NULL) {
        return MA_FALSE;
    }
    if (seekPointCount == 0 || pSeekPoints == NULL) {
        pMP3->seekPointCount = 0;
        pMP3->pSeekPoints = NULL;
    } else {
        pMP3->seekPointCount = seekPointCount;
        pMP3->pSeekPoints = pSeekPoints;
    }
    return MA_TRUE;
}